

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O1

jlong Java_fr_limsi_wapiti_WapitiJNI_opt_1defaults_1get(JNIEnv *jenv,jclass jcls)

{
  return 0x117b30;
}

Assistant:

SWIGEXPORT jlong JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1defaults_1get(JNIEnv *jenv, jclass jcls) {
  jlong jresult = 0 ;
  opt_t *result = 0 ;
  
  (void)jenv;
  (void)jcls;
  result = (opt_t *)&opt_defaults;
  *(opt_t **)&jresult = result; 
  return jresult;
}